

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O2

void __thiscall
Diligent::FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
          (FramebufferBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,FramebufferDesc *Desc,bool bIsDeviceInternal)

{
  ITextureView ***pppIVar1;
  ITextureView *pIVar2;
  long lVar3;
  uint *puVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  RenderDeviceGLImpl *pDevice_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureDesc *TexDesc;
  IMemoryAllocator *pIVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar9;
  long *plVar10;
  char (*Args_1) [47];
  char (*Args_1_00) [37];
  Uint32 i;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Uint32 i_1;
  allocator local_b1;
  long local_b0;
  MipLevelProperties MipLevelProps;
  string ViewName;
  string msg_2;
  
  DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a5a270;
  this->m_ppAttachments = (ITextureView **)0x0;
  this->m_ppReadOnlyDSVs = (ITextureView **)0x0;
  pDevice_00 = DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                          );
  ValidateFramebufferDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc,(IRenderDevice *)pDevice_00);
  if ((((this->
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        ).m_Desc.Width == 0) ||
      ((this->
       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
       ).m_Desc.Height == 0)) ||
     ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0)) {
    for (uVar11 = 0;
        uVar11 < (this->
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 ).m_Desc.AttachmentCount; uVar11 = uVar11 + 1) {
      pIVar2 = Desc->ppAttachments[uVar11];
      if (pIVar2 != (ITextureView *)0x0) {
        iVar6 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        lVar12 = CONCAT44(extraout_var,iVar6);
        if (*(char *)(lVar12 + 8) != '\x06') {
          iVar6 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar2);
          TexDesc = (TextureDesc *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar6));
          GetMipLevelProperties(&MipLevelProps,TexDesc,*(Uint32 *)(lVar12 + 0xc));
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Width == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.Width = MipLevelProps.LogicalWidth;
          }
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Height == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.Height = MipLevelProps.LogicalHeight;
          }
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.NumArraySlices == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.NumArraySlices = *(Uint32 *)(lVar12 + 0x18);
          }
        }
      }
    }
    if ((this->
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        ).m_Desc.Width == 0) {
      LogError<true,char[105]>
                (false,"FramebufferBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                 ,0x68,(char (*) [105])
                       "The framebuffer width is zero and can\'t be automatically determined as there are no non-null attachments"
                );
    }
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.Height == 0) {
    LogError<true,char[106]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6a,(char (*) [106])
                     "The framebuffer height is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0) {
    LogError<true,char[117]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6c,(char (*) [117])
                     "The framebuffer array slice count is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  pppIVar1 = &this->m_ppAttachments;
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.AttachmentCount != 0) {
    pIVar8 = GetRawAllocator();
    iVar6 = (**pIVar8->_vptr_IMemoryAllocator)
                      (pIVar8,(ulong)(this->
                                     super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                                     ).m_Desc.AttachmentCount << 3,
                       "Memory for framebuffer attachment array",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                       ,0x71);
    this->m_ppAttachments = (ITextureView **)CONCAT44(extraout_var_01,iVar6);
    (this->
    super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
    ).m_Desc.ppAttachments = (ITextureView **)CONCAT44(extraout_var_01,iVar6);
    for (uVar11 = 0;
        uVar11 < (this->
                 super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 ).m_Desc.AttachmentCount; uVar11 = uVar11 + 1) {
      if (Desc->ppAttachments[uVar11] != (ITextureView *)0x0) {
        (*pppIVar1)[uVar11] = Desc->ppAttachments[uVar11];
        (*((*pppIVar1)[uVar11]->super_IDeviceObject).super_IObject._vptr_IObject[1])();
      }
    }
  }
  (*(Desc->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[1])();
  iVar6 = (*(((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  local_b0 = CONCAT44(extraout_var_02,iVar6);
  lVar12 = 5;
  lVar13 = 0;
  uVar11 = 0;
  do {
    if (*(uint *)(local_b0 + 0x18) <= uVar11) {
      return;
    }
    lVar3 = *(long *)(local_b0 + 0x20);
    puVar4 = *(uint **)(lVar3 + lVar12 * 8);
    if (((puVar4 != (uint *)0x0) && (uVar7 = *puVar4, uVar7 != 0xffffffff)) && (puVar4[1] == 0x80))
    {
      if (this->m_ppReadOnlyDSVs == (ITextureView **)0x0) {
        pIVar8 = GetRawAllocator();
        lVar5 = local_b0;
        iVar6 = (**pIVar8->_vptr_IMemoryAllocator)
                          (pIVar8,(ulong)*(uint *)(local_b0 + 0x18) << 3,
                           "Memory for read-only depth attachment array",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                           ,0x8e);
        this->m_ppReadOnlyDSVs = (ITextureView **)CONCAT44(extraout_var_03,iVar6);
        memset((ITextureView **)CONCAT44(extraout_var_03,iVar6),0,
               (ulong)*(uint *)(lVar5 + 0x18) << 3);
        uVar7 = **(uint **)(lVar3 + lVar12 * 8);
      }
      Args_1 = (char (*) [47])*pppIVar1;
      plVar10 = *(long **)(*Args_1 + (ulong)uVar7 * 8);
      if (plVar10 == (long *)0x0) {
        FormatString<char[26],char[28]>
                  ((string *)&MipLevelProps,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pDepthAttachment != nullptr",(char (*) [28])Args_1);
        Args_1 = (char (*) [47])0x93;
        DebugAssertionFailed
                  ((Char *)MipLevelProps._0_8_,"FramebufferBase",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                   ,0x93);
        std::__cxx11::string::~string((string *)&MipLevelProps);
      }
      puVar9 = (undefined8 *)(**(code **)(*plVar10 + 0x20))(plVar10);
      MipLevelProps._0_8_ = *puVar9;
      MipLevelProps.StorageWidth = *(Uint32 *)(puVar9 + 1);
      MipLevelProps.StorageHeight = *(Uint32 *)((long)puVar9 + 0xc);
      MipLevelProps.Depth = *(Uint32 *)(puVar9 + 2);
      MipLevelProps._20_4_ = *(undefined4 *)((long)puVar9 + 0x14);
      MipLevelProps.RowSize._0_4_ = *(undefined4 *)(puVar9 + 3);
      MipLevelProps.RowSize._4_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
      MipLevelProps.DepthSliceSize = puVar9[4];
      if ((MipLevelProps.StorageWidth & 0xff) != 3) {
        if ((MipLevelProps.StorageWidth & 0xff) == 4) {
          *(long **)((long)this->m_ppReadOnlyDSVs + lVar13) = plVar10;
          (**(code **)(**(long **)((long)this->m_ppReadOnlyDSVs + lVar13) + 8))();
          goto LAB_0030bfb7;
        }
        FormatString<char[26],char[47]>
                  (&ViewName,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL",Args_1);
        DebugAssertionFailed
                  (ViewName._M_dataplus._M_p,"FramebufferBase",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                   ,0x9e);
        std::__cxx11::string::~string((string *)&ViewName);
      }
      MipLevelProps.StorageWidth = CONCAT31(MipLevelProps.StorageWidth._1_3_,4);
      std::__cxx11::string::string((string *)&msg_2,(char *)MipLevelProps._0_8_,&local_b1);
      std::operator+(&ViewName,&msg_2," (read-only)");
      std::__cxx11::string::~string((string *)&msg_2);
      MipLevelProps._0_8_ = ViewName._M_dataplus._M_p;
      plVar10 = (long *)(**(code **)(*plVar10 + 0x50))(plVar10);
      Args_1_00 = (char (*) [37])*plVar10;
      (**(code **)(Args_1_00[1] + 0x1b))
                (plVar10,&MipLevelProps,(long)this->m_ppReadOnlyDSVs + lVar13);
      if (*(long *)((long)this->m_ppReadOnlyDSVs + lVar13) == 0) {
        FormatString<char[26],char[37]>
                  (&msg_2,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_ppReadOnlyDSVs[subpass] != nullptr",Args_1_00);
        DebugAssertionFailed
                  (msg_2._M_dataplus._M_p,"FramebufferBase",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                   ,0xa3);
        std::__cxx11::string::~string((string *)&msg_2);
      }
      std::__cxx11::string::~string((string *)&ViewName);
    }
LAB_0030bfb7:
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 8;
    lVar12 = lVar12 + 9;
  } while( true );
}

Assistant:

FramebufferBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    const FramebufferDesc& Desc,
                    bool                   bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        ValidateFramebufferDesc(this->m_Desc, this->GetDevice());

        if (this->m_Desc.Width == 0 || this->m_Desc.Height == 0 || this->m_Desc.NumArraySlices == 0)
        {
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                auto* const pAttachment = Desc.ppAttachments[i];
                if (pAttachment == nullptr)
                    continue;

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
                {
                    // Dimensions of the shading rate texture are less than the dimensions of other attachments
                    // and can't be used to compute the frame buffer size.
                    continue;
                }

                const auto& TexDesc       = pAttachment->GetTexture()->GetDesc();
                const auto  MipLevelProps = GetMipLevelProperties(TexDesc, ViewDesc.MostDetailedMip);
                if (this->m_Desc.Width == 0)
                    this->m_Desc.Width = MipLevelProps.LogicalWidth;
                if (this->m_Desc.Height == 0)
                    this->m_Desc.Height = MipLevelProps.LogicalHeight;
                if (this->m_Desc.NumArraySlices == 0)
                    this->m_Desc.NumArraySlices = ViewDesc.NumArraySlices;
            }
        }

        // It is legal for a subpass to use no color or depth/stencil attachments, either because it has no attachment
        // references or because all of them are VK_ATTACHMENT_UNUSED. This kind of subpass can use shader side effects
        // such as image stores and atomics to produce an output. In this case, the subpass continues to use the width,
        // height, and layers of the framebuffer to define the dimensions of the rendering area.
        if (this->m_Desc.Width == 0)
            LOG_ERROR_AND_THROW("The framebuffer width is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.Height == 0)
            LOG_ERROR_AND_THROW("The framebuffer height is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.NumArraySlices == 0)
            LOG_ERROR_AND_THROW("The framebuffer array slice count is zero and can't be automatically determined as there are no non-null attachments");

        if (this->m_Desc.AttachmentCount > 0)
        {
            m_ppAttachments =
                ALLOCATE(GetRawAllocator(), "Memory for framebuffer attachment array", ITextureView*, this->m_Desc.AttachmentCount);
            this->m_Desc.ppAttachments = m_ppAttachments;
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (Desc.ppAttachments[i] == nullptr)
                    continue;

                m_ppAttachments[i] = Desc.ppAttachments[i];
                m_ppAttachments[i]->AddRef();
            }
        }

        Desc.pRenderPass->AddRef();

        // Create read-only depth views for read-write depth attachments, if needed
        const RenderPassDesc& RPDesc = this->m_Desc.pRenderPass->GetDesc();
        for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
        {
            const auto& SubpassDesc = RPDesc.pSubpasses[subpass];
            if (SubpassDesc.pDepthStencilAttachment == nullptr)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->AttachmentIndex == ATTACHMENT_UNUSED)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->State != RESOURCE_STATE_DEPTH_READ)
                continue;

            if (m_ppReadOnlyDSVs == nullptr)
            {
                m_ppReadOnlyDSVs =
                    ALLOCATE(GetRawAllocator(), "Memory for read-only depth attachment array", ITextureView*, RPDesc.SubpassCount);
                memset(m_ppReadOnlyDSVs, 0, sizeof(m_ppReadOnlyDSVs[0]) * RPDesc.SubpassCount);
            }

            auto* pDepthAttachment = m_ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex];
            VERIFY_EXPR(pDepthAttachment != nullptr);

            auto DSVDesc = pDepthAttachment->GetDesc();
            if (DSVDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            {
                m_ppReadOnlyDSVs[subpass] = pDepthAttachment;
                m_ppReadOnlyDSVs[subpass]->AddRef();
            }
            else
            {
                // Create read-only depth view for this attachment
                VERIFY_EXPR(DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
                DSVDesc.ViewType     = TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
                std::string ViewName = std::string{DSVDesc.Name} + " (read-only)";
                DSVDesc.Name         = ViewName.c_str();
                pDepthAttachment->GetTexture()->CreateView(DSVDesc, &m_ppReadOnlyDSVs[subpass]);
                VERIFY_EXPR(m_ppReadOnlyDSVs[subpass] != nullptr);
            }
        }
    }